

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectivePosition::writeTempData(CDirectivePosition *this,TempData *tempData)

{
  int64_t iVar1;
  string local_68;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CDirectivePosition *this_local;
  
  local_18 = tempData;
  tempData_local = (TempData *)this;
  if (this->type == Physical) {
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".orga 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (this->type == Virtual) {
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&local_68,".org 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void CDirectivePosition::writeTempData(TempData& tempData) const
{
	switch (type)
	{
	case Physical:
		tempData.writeLine(virtualAddress,tfm::format(".orga 0x%08X",position));
		break;
	case Virtual:
		tempData.writeLine(virtualAddress,tfm::format(".org 0x%08X",position));
		break;
	}
}